

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O3

char read_tag(char *dst,size_t dstlen,int *is_end_tag,char **s,size_t *slen,out_stream_info *stream)

{
  byte *pbVar1;
  byte prv;
  ushort **ppuVar2;
  ulong uVar3;
  
  if (slen != (size_t *)0x0) {
    outchar_noxlat_stream((out_stream_info *)slen,G_cmap_output[0x3c]);
  }
  if (*s == (char *)0x0) {
    prv = 0;
LAB_00130aa7:
    ppuVar2 = __ctype_b_loc();
    do {
      if ((*(byte *)((long)*ppuVar2 + (ulong)prv * 2 + 1) & 0x20) == 0) break;
      prv = nextout_copy((char **)is_end_tag,(size_t *)s,prv,(out_stream_info *)slen);
    } while (-1 < (char)prv);
  }
  else {
    *s = *s + -1;
    pbVar1 = *(byte **)is_end_tag;
    *(byte **)is_end_tag = pbVar1 + 1;
    prv = *pbVar1;
    if (-1 < (char)prv) goto LAB_00130aa7;
  }
  if ((prv == 0x5c) || (prv == 0x2f)) {
    *(undefined4 *)dstlen = 1;
    prv = nextout_copy((char **)is_end_tag,(size_t *)s,prv,(out_stream_info *)slen);
    if (-1 < (char)prv) {
      ppuVar2 = __ctype_b_loc();
      do {
        if ((*(byte *)((long)*ppuVar2 + (ulong)prv * 2 + 1) & 0x20) == 0) goto LAB_00130b42;
        prv = nextout_copy((char **)is_end_tag,(size_t *)s,prv,(out_stream_info *)slen);
      } while (-1 < (char)prv);
    }
  }
  else {
    *(undefined4 *)dstlen = 0;
LAB_00130b42:
    if (prv == 0) {
      prv = 0;
      goto LAB_00130ba1;
    }
  }
  uVar3 = 0x32;
  do {
    if ((-1 < (char)prv) &&
       ((ppuVar2 = __ctype_b_loc(), prv == 0x3e || (((*ppuVar2)[prv] & 0x2000) != 0))))
    goto LAB_00130b98;
    if (1 < uVar3) {
      *dst = prv;
      dst = (char *)((byte *)dst + 1);
      uVar3 = uVar3 - 1;
    }
    prv = nextout_copy((char **)is_end_tag,(size_t *)s,prv,(out_stream_info *)slen);
  } while (prv != 0);
  prv = 0;
LAB_00130b98:
  if (uVar3 == 0) {
    return prv;
  }
LAB_00130ba1:
  *dst = 0;
  return prv;
}

Assistant:

static char read_tag(char *dst, size_t dstlen, int *is_end_tag,
                     char **s, size_t *slen, out_stream_info *stream)
{
    char c;
    
    /* skip the opening '<' */
    c = nextout_copy(s, slen, '<', stream);

    /* skip spaces */
    while (outissp(c))
        c = nextout_copy(s, slen, c, stream);

    /* note if this is a closing tag */
    if (c == '/' || c == '\\')
    {
        /* it's an end tag - note it and skip the slash */
        *is_end_tag = TRUE;
        c = nextout_copy(s, slen, c, stream);

        /* skip yet more spaces */
        while (outissp(c))
            c = nextout_copy(s, slen, c, stream);
    }
    else
        *is_end_tag = FALSE;
    
    /* 
     *   find the end of the tag name - the tag continues to the next space,
     *   '>', or end of line 
     */
    for ( ; c != '\0' && !outissp(c) && c != '>' ;
         c = nextout_copy(s, slen, c, stream))
    {
        /* add this to the tag buffer if it fits */
        if (dstlen > 1)
        {
            *dst++ = c;
            --dstlen;
        }
    }
    
    /* null-terminate the tag name */
    if (dstlen > 0)
        *dst = '\0';

    /* return the next character */
    return c;
}